

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  Arena *this_00;
  
  this_00 = (Arena *)this->ptr_;
  if (((ulong)this_00 & 1) != 0) {
    this_00 = *(Arena **)(((ulong)this_00 & 0xfffffffffffffffe) + 0x20);
  }
  if (this_00 == (Arena *)0x0) {
    elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x28);
    (elem->_M_dataplus)._M_p = (pointer)0x0;
    elem->_M_string_length = 0;
    (elem->field_2)._M_allocated_capacity = 0;
    *(undefined8 *)((long)&elem->field_2 + 8) = 0;
    elem[1]._M_dataplus._M_p = (pointer)0x0;
    (elem->_M_dataplus)._M_p = (pointer)&elem->field_2;
    elem->_M_string_length = 0;
    (elem->field_2)._M_local_buf[0] = '\0';
  }
  else {
    elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Arena::AllocateAligned
                     (this_00,(type_info *)
                              &InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                               ::Container::typeinfo,0x28);
    (elem->_M_dataplus)._M_p = (pointer)0x0;
    elem->_M_string_length = 0;
    (elem->field_2)._M_allocated_capacity = 0;
    *(undefined8 *)((long)&elem->field_2 + 8) = 0;
    elem[1]._M_dataplus._M_p = (pointer)0x0;
    (elem->_M_dataplus)._M_p = (pointer)&elem->field_2;
    elem->_M_string_length = 0;
    (elem->field_2)._M_local_buf[0] = '\0';
    Arena::AddListNode(this_00,elem,
                       arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                      );
  }
  this->ptr_ = (void *)((ulong)elem | 1);
  elem[1]._M_dataplus._M_p = (pointer)this_00;
  return elem;
}

Assistant:

GOOGLE_ATTRIBUTE_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    ptr_ = reinterpret_cast<void*>(
        reinterpret_cast<intptr_t>(container) | kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }